

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryPacking::canSplit
          (MemoryPacking *this,
          unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment,
          Referrers *referrers)

{
  Id IVar1;
  DataSegment *pDVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  bool bVar5;
  pointer ppEVar6;
  Referrers *__range1;
  
  pDVar2 = (segment->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  if ((*(char **)((long)&(pDVar2->super_Named).name + 8) == (char *)0x0) ||
     (bVar5 = IString::startsWith<7>((IString *)pDVar2,(char (*) [7])"__llvm"), !bVar5)) {
    ppEVar6 = (referrers->
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar3 = (referrers->
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    bVar5 = ppEVar6 == ppEVar3;
    if (!bVar5) {
      do {
        pEVar4 = *ppEVar6;
        IVar1 = pEVar4->_id;
        if (IVar1 == MemoryInitId) {
          if ((((segment->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true)
             && ((*(int *)pEVar4[2].type.id != 0xe || (**(int **)(pEVar4 + 3) != 0xe)))) {
LAB_0079f796:
            if (!bVar5) goto LAB_0079f7b2;
            break;
          }
        }
        else if ((IVar1 == ArrayNewSegId) || (IVar1 == ArrayInitId)) goto LAB_0079f796;
        ppEVar6 = ppEVar6 + 1;
        bVar5 = ppEVar6 == ppEVar3;
      } while (!bVar5);
    }
    pDVar2 = (segment->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    bVar5 = true;
    if (pDVar2->isPassive == false) {
      bVar5 = pDVar2->offset->_id == ConstId;
    }
  }
  else {
LAB_0079f7b2:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool MemoryPacking::canSplit(const std::unique_ptr<DataSegment>& segment,
                             const Referrers& referrers) {
  // Don't mess with segments related to llvm coverage tools such as
  // __llvm_covfun. There segments are expected/parsed by external downstream
  // tools (llvm-cov) so they need to be left intact.
  // See https://clang.llvm.org/docs/SourceBasedCodeCoverage.html
  if (segment->name.is() && segment->name.startsWith("__llvm")) {
    return false;
  }

  for (auto* referrer : referrers) {
    if (auto* curr = referrer->dynCast<MemoryInit>()) {
      if (segment->isPassive) {
        // Do not try to split if there is a nonconstant offset or size
        if (!curr->offset->is<Const>() || !curr->size->is<Const>()) {
          return false;
        }
      }
    } else if (referrer->is<ArrayNewSeg>() || referrer->is<ArrayInit>()) {
      // TODO: Split segments referenced by GC instructions.
      return false;
    }
  }

  // Active segments can only be split if they have constant offsets
  return segment->isPassive || segment->offset->is<Const>();
}